

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O0

uint32_t NgramBuilder_add_word(NgramBuilder builder,char *words,uint32_t prob,uint32_t bow)

{
  uint32_t uVar1;
  size_t sVar2;
  char *pcVar3;
  char local_38 [4];
  uint32_t len;
  char encode_buff [20];
  uint32_t wid;
  uint32_t bow_local;
  uint32_t prob_local;
  char *words_local;
  NgramBuilder builder_local;
  
  encode_buff._16_4_ = bow;
  encode_buff._12_4_ = HashVocab_add(builder->vocab,words);
  sVar2 = _encode_uni(encode_buff._12_4_,prob,encode_buff._16_4_,local_38);
  if ((uint)sVar2 < 0x15) {
    *builder->added_gram_nums = *builder->added_gram_nums + 1;
    pcVar3 = _NgramBuilder_cp_str(builder,local_38,sVar2 & 0xffffffff);
    sVar2 = builder->added_total_gram_num;
    builder->added_total_gram_num = sVar2 + 1;
    builder->ngram_offsets[sVar2] = pcVar3;
    uVar1._0_1_ = encode_buff[0xc];
    uVar1._1_1_ = encode_buff[0xd];
    uVar1._2_1_ = encode_buff[0xe];
    uVar1._3_1_ = encode_buff[0xf];
    return uVar1;
  }
  __assert_fail("len <= 20",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c",
                0x1c2,
                "uint32_t NgramBuilder_add_word(NgramBuilder, const char *, uint32_t, uint32_t)");
}

Assistant:

uint32_t NgramBuilder_add_word(NgramBuilder builder, const char* words, uint32_t prob, uint32_t bow){
    //printf("%s ,prob:%d, bow:%d\n", words, prob, bow);
    uint32_t wid = HashVocab_add(builder->vocab, words);
    char encode_buff[20];//actually is 13
    uint32_t len = _encode_uni(wid, prob, bow, encode_buff);
    assert(len <= 20);
    builder->added_gram_nums[0]++;
    builder->ngram_offsets[builder->added_total_gram_num++] = _NgramBuilder_cp_str(builder, encode_buff, len);
    return wid;
}